

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_qb_db_dispatch.c
# Opt level: O0

parasail_result_t *
parasail_sg_qb_db_trace_scan_profile_64_dispatcher
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_result_t *ppVar2;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    if (iVar1 == 0) {
      iVar1 = parasail_can_use_sse2();
      if (iVar1 == 0) {
        return (parasail_result_t *)0x0;
      }
      parasail_sg_qb_db_trace_scan_profile_64_pointer =
           parasail_sg_qb_db_trace_scan_profile_sse2_128_64;
    }
    else {
      parasail_sg_qb_db_trace_scan_profile_64_pointer =
           parasail_sg_qb_db_trace_scan_profile_sse41_128_64;
    }
  }
  else {
    parasail_sg_qb_db_trace_scan_profile_64_pointer =
         parasail_sg_qb_db_trace_scan_profile_avx2_256_64;
  }
  ppVar2 = (*parasail_sg_qb_db_trace_scan_profile_64_pointer)(profile,s2,s2Len,open,gap);
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_sg_qb_db_trace_scan_profile_64_dispatcher(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_sg_qb_db_trace_scan_profile_64_pointer = parasail_sg_qb_db_trace_scan_profile_avx2_256_64;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_sg_qb_db_trace_scan_profile_64_pointer = parasail_sg_qb_db_trace_scan_profile_sse41_128_64;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_sg_qb_db_trace_scan_profile_64_pointer = parasail_sg_qb_db_trace_scan_profile_sse2_128_64;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_sg_qb_db_trace_scan_profile_64_pointer = parasail_sg_qb_db_trace_scan_profile_altivec_128_64;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_sg_qb_db_trace_scan_profile_64_pointer = parasail_sg_qb_db_trace_scan_profile_neon_128_64;
    }
    else
#endif
    {
        /* no fallback; caller must check for non-NULL result */
        return NULL;
    }
    return parasail_sg_qb_db_trace_scan_profile_64_pointer(profile, s2, s2Len, open, gap);
}